

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastUS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  ParseContext *ctx_00;
  ushort *puVar4;
  size_t *psVar5;
  ulong uVar6;
  char *pcVar7;
  uint *puVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 arena;
  char *extraout_RDX;
  char *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *ctx_01;
  TcParseTableBase *pTVar9;
  ArenaStringPtr *field;
  ulong hasbits_00;
  string_view str;
  
  if (data.field_0._0_2_ != 0) {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  uVar1 = *(ushort *)ptr;
  pTVar9 = table;
  field = (ArenaStringPtr *)hasbits;
  ctx_00 = (ParseContext *)
           RefAt<google::protobuf::internal::ArenaStringPtr>(msg,(ulong)data.field_0 >> 0x30);
  arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
  if ((arena.data & 1) != 0) {
    arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
            ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(arena.data & 0xfffffffffffffffe))->data;
  }
  if ((Arena *)arena.data == (Arena *)0x0) {
    puVar4 = (ushort *)
             anon_unknown_105::ReadStringNoArena
                       ((MessageLite *)(ptr + 2),(char *)ctx,ctx_00,0,pTVar9,field);
    pcVar7 = extraout_RDX_00;
  }
  else {
    puVar4 = (ushort *)
             EpsCopyInputStream::ReadArenaString
                       (&ctx->super_EpsCopyInputStream,ptr + 2,(ArenaStringPtr *)ctx_00,
                        (Arena *)arena);
    pcVar7 = extraout_RDX;
  }
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  if (puVar4 == (ushort *)0x0) {
    anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)ctx_00);
    ctx_01 = extraout_RDX_01;
  }
  else {
    psVar5 = (size_t *)((ulong)(ctx_00->super_EpsCopyInputStream).limit_end_ & 0xfffffffffffffffc);
    str._M_str = pcVar7;
    str._M_len = *psVar5;
    bVar2 = utf8_range::IsStructurallyValid((utf8_range *)psVar5[1],str);
    if (bVar2) {
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar4) {
        if ((ulong)table->has_bits_offset != 0) {
          puVar8 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
          *puVar8 = *puVar8 | (uint)hasbits_00;
        }
        return (char *)puVar4;
      }
      uVar3 = (uint)table->fast_idx_mask & (uint)*puVar4;
      if ((uVar3 & 7) == 0) {
        uVar6 = (ulong)(uVar3 & 0xfffffff8);
        pcVar7 = (char *)(**(code **)(&table[1].has_bits_offset + uVar6))
                                   (msg,puVar4,ctx,
                                    (ulong)*puVar4 ^ *(ulong *)(&table[1].fast_idx_mask + uVar6 * 2)
                                    ,table,hasbits_00);
        return pcVar7;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    ctx_00 = (ParseContext *)table;
    ReportFastUtf8Error((int)(char)uVar1 + (uint)uVar1 >> 1,table);
    ctx_01 = extraout_RDX_02;
  }
  pcVar7 = Error(msg,(char *)ctx_00,ctx_01,(TcFieldData)arena,table,hasbits_00);
  return pcVar7;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastUS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint16_t, ArenaStringPtr, kUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}